

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

double __thiscall ON_SubDMatrix::TestEvaluation(ON_SubDMatrix *this)

{
  double **ppdVar1;
  ON_3dPoint Q;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ON_3dPoint *SP_00;
  ON_SubD *pOVar9;
  ON_SubDVertex *center_vertex;
  ON_SubDVertex *pOVar10;
  ON_SubDComponentPtr *component_ring_00;
  ON_3dPoint *pOVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double local_340;
  double d;
  uint i_2;
  uint local_25c;
  uint j_1;
  ON_3dPoint local_240;
  ON_3dVector local_228;
  uint local_210;
  uint local_20c;
  uint j;
  uint i_1;
  ON_3dPoint *ringP1;
  ON_3dPoint *pOStack_1f8;
  uint i;
  ON_3dPoint *ringP0;
  double **ppdStack_1e8;
  uint Pi;
  double N_Scol_precision [3];
  double **local_1c8;
  double N_outer_point_precision [3];
  double **local_1a8;
  double N_vertex_point_precision [3];
  uint vi_1;
  uint vi;
  ON_SimpleArray<ON_3dPoint> _ringP1;
  ON_SimpleArray<ON_3dPoint> _ringP0;
  ON_SubDComponentPtr *component_ring;
  undefined1 local_148 [4];
  uint component_ring_count;
  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  ON_SubDVertex **vertex_ring;
  ON_SubDVertex *vertex;
  ON_SimpleArray<const_ON_SubDVertex_*> vertex_ring_array;
  ON_SubDSectorIterator sit;
  ON_SubDVertex *vertex0;
  undefined1 local_b0 [8];
  ON_SubD subd;
  double *Scol;
  ON_SimpleArray<double> _Scol;
  ON_3dPoint *SP;
  ON_SimpleArray<ON_3dPoint> _P;
  uint SP_low_precision_index;
  double **S;
  double rc;
  uint f_edge_count;
  uint R;
  uint N;
  uint F;
  ON_SubDMatrix *this_local;
  
  if ((this->m_S == (double **)0x0) || (this->m_R < 3)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
  }
  else {
    bVar4 = ON_SubDSectorType::IsValid(&this->m_sector_type);
    if (bVar4) {
      uVar5 = ON_SubDSectorType::FaceCount(&this->m_sector_type);
      if (uVar5 == 0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
      }
      else {
        uVar6 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
        if (uVar6 == 0) {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
        }
        else {
          uVar7 = ON_SubDSectorType::PointRingCount(&this->m_sector_type);
          if (uVar7 == 0) {
            ON_SubDIncrementErrorCount();
            this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
          }
          else if (uVar7 == this->m_R) {
            uVar8 = ON_SubDSectorType::FacetEdgeCount(&this->m_sector_type);
            if (uVar8 == 0) {
              ON_SubDIncrementErrorCount();
              this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
            }
            else {
              S = (double **)TestMatrix(this);
              ppdVar1 = this->m_S;
              _P.m_capacity = -1;
              ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                        ((ON_SimpleArray<ON_3dPoint> *)&SP,(ulong)uVar7);
              SP_00 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)&SP);
              ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&Scol,(ulong)uVar7);
              subd.m_subdimple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)&Scol);
              ON_SubD::ON_SubD((ON_SubD *)local_b0);
              pOVar9 = ON_SubDSectorType::SectorRingSubD
                                 (&this->m_sector_type,0.0,0.0,(ON_SubD *)local_b0);
              if ((ON_SubD *)local_b0 == pOVar9) {
                center_vertex = ON_SubD::FirstVertex((ON_SubD *)local_b0);
                if (center_vertex == (ON_SubDVertex *)0x0) {
                  ON_SubDIncrementErrorCount();
                  this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                }
                else if (uVar6 == center_vertex->m_edge_count) {
                  if (uVar5 == center_vertex->m_face_count) {
                    ON_SubDSectorIterator::ON_SubDSectorIterator
                              ((ON_SubDSectorIterator *)&vertex_ring_array.m_count);
                    pOVar10 = ON_SubDSectorIterator::Initialize
                                        ((ON_SubDSectorIterator *)&vertex_ring_array.m_count,
                                         center_vertex);
                    if (pOVar10 == (ON_SubDVertex *)0x0) {
                      ON_SubDIncrementErrorCount();
                      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                    }
                    else {
                      uVar5 = ON_SubD::VertexCount((ON_SubD *)local_b0);
                      ON_SimpleArray<const_ON_SubDVertex_*>::ON_SimpleArray
                                ((ON_SimpleArray<const_ON_SubDVertex_*> *)&vertex,(ulong)uVar5);
                      for (vertex_ring = (ON_SubDVertex **)center_vertex;
                          vertex_ring != (ON_SubDVertex **)0x0;
                          vertex_ring = (ON_SubDVertex **)vertex_ring[0xb]) {
                        ON_SimpleArray<const_ON_SubDVertex_*>::Append
                                  ((ON_SimpleArray<const_ON_SubDVertex_*> *)&vertex,
                                   (ON_SubDVertex **)&vertex_ring);
                      }
                      uVar5 = ON_SimpleArray<const_ON_SubDVertex_*>::UnsignedCount
                                        ((ON_SimpleArray<const_ON_SubDVertex_*> *)&vertex);
                      if (uVar7 == uVar5) {
                        component_ring_array._16_8_ =
                             ON_SimpleArray<const_ON_SubDVertex_*>::Array
                                       ((ON_SimpleArray<const_ON_SubDVertex_*> *)&vertex);
                        ON_SimpleArray<ON_SubDComponentPtr>::ON_SimpleArray
                                  ((ON_SimpleArray<ON_SubDComponentPtr> *)local_148);
                        uVar5 = ON_SubD::GetSectorComponentRing
                                          ((ON_SubDSectorIterator *)&vertex_ring_array.m_count,
                                           (ON_SimpleArray<ON_SubDComponentPtr> *)local_148);
                        if ((uVar5 < 4) ||
                           (uVar6 = ON_SubDSectorType::ComponentRingCount(&this->m_sector_type),
                           uVar5 != uVar6)) {
                          ON_SubDIncrementErrorCount();
                          this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                        }
                        else {
                          component_ring_00 =
                               ON_SimpleArray<ON_SubDComponentPtr>::Array
                                         ((ON_SimpleArray<ON_SubDComponentPtr> *)local_148);
                          ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                                    ((ON_SimpleArray<ON_3dPoint> *)&_ringP1.m_count);
                          ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                                    ((ON_SimpleArray<ON_3dPoint> *)&vi_1);
                          for (N_vertex_point_precision[2]._4_4_ = 0;
                              N_vertex_point_precision[2]._4_4_ < uVar7;
                              N_vertex_point_precision[2]._4_4_ =
                                   N_vertex_point_precision[2]._4_4_ + 1) {
                            (&(subd.m_subdimple_sp.
                               super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base)
                            [N_vertex_point_precision[2]._4_4_] = (_func_int **)ON_DBL_QNAN;
                          }
                          for (N_vertex_point_precision[2]._0_4_ = 0;
                              N_vertex_point_precision[2]._0_4_ < uVar7;
                              N_vertex_point_precision[2]._0_4_ =
                                   N_vertex_point_precision[2]._0_4_ + 1) {
                            memset(&local_1a8,0,0x18);
                            memset(&local_1c8,0,0x18);
                            memset(&stack0xfffffffffffffe18,0,0x18);
                            for (ringP0._4_4_ = 0; ringP0._4_4_ < 3; ringP0._4_4_ = ringP0._4_4_ + 1
                                ) {
                              bVar4 = ClearCachedPoints(uVar5,component_ring_00);
                              if (!bVar4) {
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              *(undefined8 *)
                               (*(long *)(component_ring_array._16_8_ +
                                         (ulong)N_vertex_point_precision[2]._0_4_ * 8) + 0x80 +
                               (ulong)ringP0._4_4_ * 8) = 0x3ff0000000000000;
                              uVar6 = ON_SubD::GetSectorPointRing
                                                (false,(ulong)uVar5,component_ring_00,
                                                 (ON_SimpleArray<ON_3dPoint> *)&_ringP1.m_count);
                              if (uVar7 != uVar6) {
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              pOStack_1f8 = ON_SimpleArray<ON_3dPoint>::Array
                                                      ((ON_SimpleArray<ON_3dPoint> *)
                                                       &_ringP1.m_count);
                              for (ringP1._4_4_ = 0; ringP1._4_4_ < uVar7;
                                  ringP1._4_4_ = ringP1._4_4_ + 1) {
                                dVar13 = ON_3dPoint::operator[]
                                                   (pOStack_1f8 + ringP1._4_4_,
                                                    ringP0._4_4_ + 1 + ((ringP0._4_4_ + 1) / 3) * -3
                                                   );
                                if ((dVar13 != 0.0) || (NAN(dVar13))) {
LAB_008d073b:
                                  ON_SubDIncrementErrorCount();
                                  this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                  goto LAB_008d0d52;
                                }
                                dVar13 = ON_3dPoint::operator[]
                                                   (pOStack_1f8 + ringP1._4_4_,
                                                    ringP0._4_4_ + 2 + ((ringP0._4_4_ + 2) / 3) * -3
                                                   );
                                if ((dVar13 != 0.0) || (NAN(dVar13))) goto LAB_008d073b;
                                dVar13 = ON_3dPoint::operator[]
                                                   (pOStack_1f8 + ringP1._4_4_,ringP0._4_4_);
                                local_340 = 1.0;
                                if (ringP1._4_4_ != N_vertex_point_precision[2]._0_4_) {
                                  local_340 = 0.0;
                                }
                                if ((dVar13 != local_340) || (NAN(dVar13) || NAN(local_340)))
                                goto LAB_008d073b;
                              }
                              uVar6 = ON_SubD::GetSectorSubdivisionPointRing
                                                (component_ring_00,(ulong)uVar5,
                                                 (ON_SimpleArray<ON_3dPoint> *)&vi_1);
                              if (uVar7 != uVar6) {
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              _j = ON_SimpleArray<ON_3dPoint>::Array
                                             ((ON_SimpleArray<ON_3dPoint> *)&vi_1);
                              for (local_20c = 0; local_20c < uVar7; local_20c = local_20c + 1) {
                                pOVar11 = SP_00 + local_20c;
                                pOVar11->x = ON_3dPoint::Origin.x;
                                pOVar11->y = ON_3dPoint::Origin.y;
                                pOVar11->z = ON_3dPoint::Origin.z;
                                for (local_210 = 0; local_210 < uVar7; local_210 = local_210 + 1) {
                                  ::operator*(&local_240,ppdVar1[local_20c][local_210],
                                              pOStack_1f8 + local_210);
                                  ON_3dVector::ON_3dVector(&local_228,&local_240);
                                  ON_3dPoint::operator+=(SP_00 + local_20c,&local_228);
                                }
                              }
                              pdVar12 = ON_3dPoint::operator[]
                                                  (SP_00 + N_vertex_point_precision[2]._0_4_,
                                                   ringP0._4_4_);
                              if (*pdVar12 <= 0.0) {
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              bVar4 = TestPoint(SP_00,0,*_j,ringP0._4_4_,(double *)&local_1a8,
                                                (uint *)&_P.m_capacity);
                              if (!bVar4) {
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              for (local_25c = 1; local_25c < uVar7; local_25c = local_25c + 1) {
                                uVar2 = _j[local_25c].x;
                                uVar3 = _j[local_25c].y;
                                Q.y = (double)uVar3;
                                Q.x = (double)uVar2;
                                Q.z = _j[local_25c].z;
                                bVar4 = TestPoint(SP_00,local_25c,Q,ringP0._4_4_,
                                                  (double *)&local_1c8,(uint *)&_P.m_capacity);
                                if (!bVar4) {
                                  ON_SubDIncrementErrorCount();
                                  this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                  goto LAB_008d0d52;
                                }
                              }
                              for (d._4_4_ = 0; d._4_4_ < uVar7; d._4_4_ = d._4_4_ + 1) {
                                dVar13 = ppdVar1[d._4_4_][N_vertex_point_precision[2]._0_4_];
                                dVar14 = ON_3dPoint::operator[](_j + d._4_4_,ringP0._4_4_);
                                dVar13 = ABS(dVar13 - dVar14);
                                if (*(double *)
                                     ((long)&stack0xfffffffffffffe18 + (ulong)ringP0._4_4_ * 8) <=
                                    dVar13 && dVar13 != *(double *)
                                                         ((long)&stack0xfffffffffffffe18 +
                                                         (ulong)ringP0._4_4_ * 8)) {
                                  *(double *)
                                   ((long)&stack0xfffffffffffffe18 + (ulong)ringP0._4_4_ * 8) =
                                       dVar13;
                                }
                              }
                              if (((double)local_1a8 !=
                                   N_vertex_point_precision[(ulong)ringP0._4_4_ - 1]) ||
                                 (NAN((double)local_1a8) ||
                                  NAN(N_vertex_point_precision[(ulong)ringP0._4_4_ - 1]))) {
                                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                                           ,0x19c,"",
                                           "x,y,z vertex point precisions are not identical.");
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              if (((double)local_1c8 !=
                                   N_outer_point_precision[(ulong)ringP0._4_4_ - 1]) ||
                                 (NAN((double)local_1c8) ||
                                  NAN(N_outer_point_precision[(ulong)ringP0._4_4_ - 1]))) {
                                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                                           ,0x1a1,"",
                                           "x,y,z outer point precisions are not identical.");
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              if (((double)ppdStack_1e8 !=
                                   *(double *)
                                    ((long)&stack0xfffffffffffffe18 + (ulong)ringP0._4_4_ * 8)) ||
                                 (NAN((double)ppdStack_1e8) ||
                                  NAN(*(double *)
                                       ((long)&stack0xfffffffffffffe18 + (ulong)ringP0._4_4_ * 8))))
                              {
                                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                                           ,0x1a6,"","x,y,z S column precisions are not identical.")
                                ;
                                ON_SubDIncrementErrorCount();
                                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                                goto LAB_008d0d52;
                              }
                              if ((double)S < (double)local_1a8) {
                                S = local_1a8;
                              }
                              if ((double)S < (double)local_1c8) {
                                S = local_1c8;
                              }
                              if ((double)S < (double)ppdStack_1e8) {
                                S = ppdStack_1e8;
                              }
                              *(undefined8 *)
                               (*(long *)(component_ring_array._16_8_ +
                                         (ulong)N_vertex_point_precision[2]._0_4_ * 8) + 0x80 +
                               (ulong)ringP0._4_4_ * 8) = 0;
                            }
                          }
                          this_local = (ON_SubDMatrix *)S;
LAB_008d0d52:
                          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray
                                    ((ON_SimpleArray<ON_3dPoint> *)&vi_1);
                          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray
                                    ((ON_SimpleArray<ON_3dPoint> *)&_ringP1.m_count);
                        }
                        ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray
                                  ((ON_SimpleArray<ON_SubDComponentPtr> *)local_148);
                      }
                      else {
                        ON_SubDIncrementErrorCount();
                        this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                      }
                      ON_SimpleArray<const_ON_SubDVertex_*>::~ON_SimpleArray
                                ((ON_SimpleArray<const_ON_SubDVertex_*> *)&vertex);
                    }
                  }
                  else {
                    ON_SubDIncrementErrorCount();
                    this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                  }
                }
                else {
                  ON_SubDIncrementErrorCount();
                  this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                }
              }
              else {
                ON_SubDIncrementErrorCount();
                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
              }
              ON_SubD::~ON_SubD((ON_SubD *)local_b0);
              ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&Scol);
              ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&SP);
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
          }
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
    }
  }
  return (double)this_local;
}

Assistant:

double ON_SubDMatrix::TestEvaluation() const
{
  if ( nullptr == m_S || m_R < 3 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (!m_sector_type.IsValid())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int F = m_sector_type.FaceCount();
  if (0 == F)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int N = m_sector_type.EdgeCount();
  if (0 == N)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int R = m_sector_type.PointRingCount();
  if (0 == R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (R != m_R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  const unsigned f_edge_count = m_sector_type.FacetEdgeCount();
  if (0 == f_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = TestMatrix();
  const double*const* S = m_S;
  
  unsigned int SP_low_precision_index = ON_UNSET_UINT_INDEX;
  
  ON_SimpleArray< ON_3dPoint > _P(R);
  ON_3dPoint* SP = _P.Array();

  ON_SimpleArray< double > _Scol(R);
  double* Scol = _Scol.Array();

  ON_SubD subd;
  if (&subd != m_sector_type.SectorRingSubD(0.0,0.0,&subd))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex* vertex0 = subd.FirstVertex();
  if (nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (N != vertex0->m_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (F != vertex0->m_face_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  ON_SubDSectorIterator sit;
  if ( nullptr == sit.Initialize(vertex0) )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  ON_SimpleArray<const ON_SubDVertex*> vertex_ring_array(subd.VertexCount());
  for (const ON_SubDVertex* vertex = vertex0; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    vertex_ring_array.Append(vertex);
  }
  if ( R != vertex_ring_array.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex*const* vertex_ring = vertex_ring_array.Array();

  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  const unsigned int component_ring_count = ON_SubD::GetSectorComponentRing(sit,component_ring_array);
  if ( component_ring_count < 4 || component_ring_count != m_sector_type.ComponentRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDComponentPtr* component_ring = component_ring_array.Array();

  ON_SimpleArray< ON_3dPoint > _ringP0;

  ON_SimpleArray< ON_3dPoint > _ringP1;

  for (unsigned int vi = 0; vi < R; vi++)
    Scol[vi] = ON_DBL_QNAN;

  for (unsigned int vi = 0; vi < R; vi++)
  {
    double N_vertex_point_precision[3] = { 0 };
    double N_outer_point_precision[3] = { 0 };
    double N_Scol_precision[3] = { 0 };

    for (unsigned int Pi = 0; Pi < 3; Pi++)
    {
      if (false == ClearCachedPoints(component_ring_count,component_ring))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 1.0;

      if ( R != ON_SubD::GetSectorPointRing(false,component_ring_count,component_ring,_ringP0))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP0 = _ringP0.Array();

      // vertex_ring[]->m_P and ringP0[] should be same point lists
      for (unsigned int i = 0; i < R; i++)
      {
        if (0.0 == ringP0[i][(Pi+1)%3] && 0.0 == ringP0[i][(Pi+2)%3])
        {
          if ( ringP0[i][Pi] == ((i == vi) ? 1.0 : 0.0) )
            continue;
        }
        // vertex_ring[] is not in the expected order or
        // there is a bug in ON_SubD::GetSectorPointRing
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if ( R != ON_SubD::GetSectorSubdivisionPointRing(component_ring, component_ring_count,_ringP1))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP1 = _ringP1.Array();

      for (unsigned int i = 0; i < R; i++)
      {
        SP[i] = ON_3dPoint::Origin;
        for (unsigned int j = 0; j < R; j++)
        {
          SP[i] += S[i][j] * ringP0[j];
        }
      }

      if (!(SP[vi][Pi] > 0.0))
      {
        // ON_ERROR("SP[vi][Pi] is not positive.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (false == TestPoint(SP, 0, ringP1[0], Pi, N_vertex_point_precision, &SP_low_precision_index))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      for (unsigned int j = 1; j < R; j++)
      {
        if (false == TestPoint(SP, j, ringP1[j], Pi, N_outer_point_precision, &SP_low_precision_index))
          return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      for (unsigned int i = 0; i < R; i++)
      {
        double d = fabs(S[i][vi] - ringP1[i][Pi]);
        if (d > N_Scol_precision[Pi])
          N_Scol_precision[Pi] = d;
      }

      if (!(N_vertex_point_precision[0] == N_vertex_point_precision[Pi]))
      {
        ON_ERROR("x,y,z vertex point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_outer_point_precision[0] == N_outer_point_precision[Pi]))
      {
        ON_ERROR("x,y,z outer point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_Scol_precision[0] == N_Scol_precision[Pi]))
      {
        ON_ERROR("x,y,z S column precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (rc < N_vertex_point_precision[0])
        rc = N_vertex_point_precision[0];
      if (rc < N_outer_point_precision[0])
        rc = N_outer_point_precision[0];
      if (rc < N_Scol_precision[0])
        rc = N_Scol_precision[0];

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 0.0;
    }
  }

  return rc; // basic tests passed.
}